

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafuzz.c
# Opt level: O2

int main(int argc,char **argv)

{
  int32_t iVar1;
  int iVar2;
  uint32_t uVar3;
  int extraout_EAX;
  time_t tVar4;
  char *__ptr;
  uint uVar5;
  size_t sStack_50;
  int cnum;
  int32_t b;
  int32_t a;
  
  iVar2 = nva_init();
  if (iVar2 == 0) {
    cnum = 0;
    while( true ) {
      iVar2 = getopt(argc,argv,"hc:");
      if (iVar2 != 99) break;
      __isoc99_sscanf(_optarg,"%d",&cnum);
    }
    if (iVar2 != -1) {
      if (iVar2 == 0x68) {
        usage(0);
      }
      usage(1);
      return extraout_EAX;
    }
    if (cnum < nva_cardsnum) {
      b = 4;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&a);
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&b);
        }
        tVar4 = time((time_t *)0x0);
        srand((int)tVar4 + *(int *)((long)nva_cards[cnum]->bar0 + 0x9400));
        do {
          iVar1 = a;
          uVar3 = proper_rand(0x18);
          uVar5 = uVar3 % (uint)b;
          uVar3 = proper_rand(0x20);
          *(uint32_t *)((long)nva_cards[cnum]->bar0 + (ulong)(uVar5 + iVar1 & 0xfffffc)) = uVar3;
        } while( true );
      }
      __ptr = "No address specified.\n";
      sStack_50 = 0x16;
    }
    else if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_50 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_50 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_50 = 0x12;
  }
  fwrite(__ptr,sStack_50,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "hc:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'h':
				usage(0);
			default:
				usage(1);
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	srand(time(0) + nva_rd32(cnum, 0x9400));
	while (1) {
		uint32_t reg = (a + proper_rand(24) % b) & 0xfffffc;
		uint32_t val = proper_rand(32);
		nva_wr32(cnum, reg, val);
	}
	return 0;
}